

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_alignment_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  CompilerError *pCVar1;
  ulong uVar2;
  size_t sVar3;
  uint *puVar4;
  uint32_t local_14c;
  uint32_t local_144;
  uint32_t local_e0;
  uint32_t vecsize;
  uint local_d8;
  uint32_t i;
  uint32_t alignment;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [35];
  undefined1 local_5d;
  allocator local_49;
  string local_48 [38];
  undefined1 local_22;
  undefined1 local_21;
  bool row_major_local;
  SPIRType *pSStack_20;
  bool is_packed_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  local_22 = row_major;
  local_21 = is_packed;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
  case 0:
  case 1:
  case 0xb:
  case 0x10:
  case 0x11:
  case 0x12:
    local_5d = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_48,"Querying alignment of opaque object.",&local_49);
    CompilerError::CompilerError(pCVar1,(string *)local_48);
    local_5d = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  default:
    if (is_packed) {
      this_local._4_4_ = type->width >> 3;
    }
    else {
      if ((row_major) && (1 < type->columns)) {
        local_144 = type->columns;
      }
      else {
        local_144 = type->vecsize;
      }
      if (local_144 == 3) {
        local_14c = 4;
      }
      else {
        local_14c = local_144;
      }
      this_local._4_4_ = (type->width >> 3) * local_14c;
    }
    break;
  case 9:
    local_82 = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_80,"long types are not supported in buffers in MSL.",&local_81);
    CompilerError::CompilerError(pCVar1,(string *)local_80);
    local_82 = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 10:
    local_aa = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_a8,"ulong types are not supported in buffers in MSL.",&local_a9);
    CompilerError::CompilerError(pCVar1,(string *)local_a8);
    local_aa = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0xe:
    i._2_1_ = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&alignment,"double types are not supported in buffers in MSL.",
               (allocator *)((long)&i + 3));
    CompilerError::CompilerError(pCVar1,(string *)&alignment);
    i._2_1_ = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0xf:
    local_d8 = 1;
    for (vecsize = 0; uVar2 = (ulong)vecsize,
        sVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(pSStack_20->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
        uVar2 < sVar3; vecsize = vecsize + 1) {
      local_e0 = get_declared_struct_member_alignment_msl(this,pSStack_20,vecsize);
      puVar4 = ::std::max<unsigned_int>(&local_d8,&local_e0);
      local_d8 = *puVar4;
    }
    this_local._4_4_ = local_d8;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_alignment_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying alignment of opaque object.");

	case SPIRType::Int64:
		SPIRV_CROSS_THROW("long types are not supported in buffers in MSL.");
	case SPIRType::UInt64:
		SPIRV_CROSS_THROW("ulong types are not supported in buffers in MSL.");
	case SPIRType::Double:
		SPIRV_CROSS_THROW("double types are not supported in buffers in MSL.");

	case SPIRType::Struct:
	{
		// In MSL, a struct's alignment is equal to the maximum alignment of any of its members.
		uint32_t alignment = 1;
		for (uint32_t i = 0; i < type.member_types.size(); i++)
			alignment = max(alignment, uint32_t(get_declared_struct_member_alignment_msl(type, i)));
		return alignment;
	}

	default:
	{
		// Alignment of packed type is the same as the underlying component or column size.
		// Alignment of unpacked type is the same as the vector size.
		// Alignment of 3-elements vector is the same as 4-elements (including packed using column).
		if (is_packed)
		{
			// If we have packed_T and friends, the alignment is always scalar.
			return type.width / 8;
		}
		else
		{
			// This is the general rule for MSL. Size == alignment.
			uint32_t vecsize = (row_major && type.columns > 1) ? type.columns : type.vecsize;
			return (type.width / 8) * (vecsize == 3 ? 4 : vecsize);
		}
	}
	}
}